

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O1

bool vkt::image::anon_unknown_0::comparePixelBuffers
               (TestLog *log,Texture *texture,VkFormat format,ConstPixelBufferAccess *reference,
               ConstPixelBufferAccess *result)

{
  bool bVar1;
  bool bVar2;
  int i;
  IVec3 *pIVar3;
  long *plVar4;
  TextureFormat *pTVar5;
  long lVar6;
  long *plVar7;
  ulong *puVar8;
  TextureFormat TVar9;
  uint layer;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ConstPixelBufferAccess resultLayer;
  string comparisonName;
  string comparisonDesc;
  ConstPixelBufferAccess refLayer;
  bool local_389;
  undefined1 local_388 [16];
  long local_378;
  TextureFormat TStack_370;
  uint local_35c;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  ulong *local_338;
  long local_330;
  ulong local_328;
  long lStack_320;
  ImageType local_314;
  ulong *local_310;
  long local_308;
  ulong local_300 [2];
  TestLog *local_2f0;
  ConstPixelBufferAccess *local_2e8;
  ConstPixelBufferAccess *local_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  Vec4 local_298;
  IVec3 *local_280;
  IVec3 *local_278;
  IVec3 *local_270;
  IVec3 *local_268;
  Texture *local_260;
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  ConstPixelBufferAccess local_1f8;
  ConstPixelBufferAccess local_1d0;
  ConstPixelBufferAccess local_1a8 [2];
  ios_base local_138 [264];
  
  local_2f0 = log;
  local_2e8 = result;
  local_2e0 = reference;
  bVar2 = ::vk::isIntFormat(format);
  local_389 = true;
  if (!bVar2) {
    local_389 = ::vk::isUintFormat(format);
  }
  local_314 = texture->m_type;
  if (local_314 == IMAGE_TYPE_3D) {
    Texture::size(texture);
    pIVar3 = &local_1a8[0].m_size;
  }
  else {
    pIVar3 = (IVec3 *)&texture->m_numLayers;
  }
  local_35c = pIVar3->m_data[0];
  if ((int)local_35c < 1) {
    uVar12 = 0;
  }
  else {
    local_268 = &local_2e0->m_size;
    local_270 = &local_2e0->m_pitch;
    local_278 = &local_2e8->m_size;
    local_280 = &local_2e8->m_pitch;
    uVar12 = 0;
    layer = 0;
    local_260 = texture;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,layer);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0xae789d);
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_348 = *plVar7;
        lStack_340 = plVar4[3];
        local_358 = &local_348;
      }
      else {
        local_348 = *plVar7;
        local_358 = (long *)*plVar4;
      }
      local_350 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((long *)local_388._0_8_ != &local_378) {
        operator_delete((void *)local_388._0_8_,local_378 + 1);
      }
      uVar11 = texture->m_type - IMAGE_TYPE_CUBE;
      if (uVar11 < 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,layer % 6);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0xb8193a);
        local_2d8 = &local_2c8;
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_2c8 = *plVar7;
          lStack_2c0 = plVar4[3];
        }
        else {
          local_2c8 = *plVar7;
          local_2d8 = (long *)*plVar4;
        }
        local_2d0 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_2d8);
        local_338 = &local_328;
        puVar8 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar8) {
          local_328 = *puVar8;
          lStack_320 = plVar4[3];
        }
        else {
          local_328 = *puVar8;
          local_338 = (ulong *)*plVar4;
        }
        local_330 = plVar4[1];
        *plVar4 = (long)puVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,layer / 6);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar10 = 0xf;
        if (local_338 != &local_328) {
          uVar10 = local_328;
        }
        if (uVar10 < (ulong)(local_308 + local_330)) {
          uVar10 = 0xf;
          if (local_310 != local_300) {
            uVar10 = local_300[0];
          }
          if (uVar10 < (ulong)(local_308 + local_330)) goto LAB_0071f22a;
          pTVar5 = (TextureFormat *)
                   std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,(ulong)local_338);
        }
        else {
LAB_0071f22a:
          pTVar5 = (TextureFormat *)
                   std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_310);
        }
        local_388._0_8_ = &local_378;
        TVar9 = (TextureFormat)(pTVar5 + 2);
        if (*pTVar5 == TVar9) {
          local_378 = *(long *)TVar9;
          TStack_370 = pTVar5[3];
        }
        else {
          local_378 = *(long *)TVar9;
          local_388._0_8_ = *pTVar5;
        }
        local_388._8_8_ = pTVar5[1];
        *pTVar5 = TVar9;
        bVar2 = false;
LAB_0071f2ac:
        bVar1 = false;
      }
      else {
        if (local_314 == IMAGE_TYPE_3D) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::ostream::operator<<(local_1a8,layer);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          pTVar5 = (TextureFormat *)
                   std::__cxx11::string::replace((ulong)local_238,0,(char *)0x0,0xb385d1);
          local_388._0_8_ = &local_378;
          TVar9 = (TextureFormat)(pTVar5 + 2);
          if (*pTVar5 == TVar9) {
            local_378 = *(long *)TVar9;
            TStack_370 = pTVar5[3];
          }
          else {
            local_378 = *(long *)TVar9;
            local_388._0_8_ = *pTVar5;
          }
          local_388._8_8_ = pTVar5[1];
          *pTVar5 = TVar9;
          bVar2 = true;
          goto LAB_0071f2ac;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::operator<<(local_1a8,layer);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        pTVar5 = (TextureFormat *)
                 std::__cxx11::string::replace((ulong)local_258,0,(char *)0x0,0xae6e7c);
        local_388._0_8_ = &local_378;
        TVar9 = (TextureFormat)(pTVar5 + 2);
        if (*pTVar5 == TVar9) {
          local_378 = *(long *)TVar9;
          TStack_370 = pTVar5[3];
        }
        else {
          local_378 = *(long *)TVar9;
          local_388._0_8_ = *pTVar5;
        }
        local_388._8_8_ = pTVar5[1];
        *pTVar5 = TVar9;
        bVar1 = true;
        bVar2 = false;
      }
      pTVar5[1].order = R;
      pTVar5[1].type = SNORM_INT8;
      *(undefined1 *)TVar9 = 0;
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_388,0,(char *)0x0,0xb385b6);
      local_2b8 = &local_2a8;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_2a8 = *plVar7;
        lStack_2a0 = plVar4[3];
      }
      else {
        local_2a8 = *plVar7;
        local_2b8 = (long *)*plVar4;
      }
      local_2b0 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((long *)local_388._0_8_ != &local_378) {
        operator_delete((void *)local_388._0_8_,local_378 + 1);
      }
      if ((bVar1) && (local_258[0] != local_248)) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      if ((bVar2) && (local_238[0] != local_228)) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      if (uVar11 < 2) {
        if (local_310 != local_300) {
          operator_delete(local_310,local_300[0] + 1);
        }
        if (uVar11 < 2) {
          if (local_338 != &local_328) {
            operator_delete(local_338,local_328 + 1);
          }
          if (local_2d8 != &local_2c8) {
            operator_delete(local_2d8,local_2c8 + 1);
          }
          if (local_218[0] != local_208) {
            operator_delete(local_218[0],local_208[0] + 1);
          }
        }
      }
      texture = local_260;
      local_1d0.m_format = local_2e0->m_format;
      local_1d0.m_size.m_data[2] = local_268->m_data[2];
      local_1d0.m_size.m_data._0_8_ = *(undefined8 *)local_268->m_data;
      local_1d0.m_pitch.m_data[2] = local_270->m_data[2];
      local_1d0.m_pitch.m_data._0_8_ = *(undefined8 *)local_270->m_data;
      local_1d0.m_data = local_2e0->m_data;
      getLayerOrSlice(local_1a8,local_260,&local_1d0,layer);
      local_1f8.m_format = local_2e8->m_format;
      local_1f8.m_size.m_data[2] = local_278->m_data[2];
      local_1f8.m_size.m_data._0_8_ = *(undefined8 *)local_278->m_data;
      local_1f8.m_pitch.m_data[2] = local_280->m_data[2];
      local_1f8.m_pitch.m_data._0_8_ = *(undefined8 *)local_280->m_data;
      local_1f8.m_data = local_2e8->m_data;
      getLayerOrSlice((ConstPixelBufferAccess *)local_388,texture,&local_1f8,layer);
      if (local_389 == false) {
        lVar6 = 0;
        do {
          local_298.m_data[lVar6] = 0.01;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        bVar2 = tcu::floatThresholdCompare
                          (local_2f0,(char *)local_358,(char *)local_2b8,local_1a8,
                           (ConstPixelBufferAccess *)local_388,&local_298,COMPARE_LOG_RESULT);
      }
      else {
        local_298.m_data[0] = 0.0;
        local_298.m_data[1] = 0.0;
        local_298.m_data[2] = 0.0;
        local_298.m_data[3] = 0.0;
        bVar2 = tcu::intThresholdCompare
                          (local_2f0,(char *)local_358,(char *)local_2b8,local_1a8,
                           (ConstPixelBufferAccess *)local_388,(UVec4 *)&local_298,
                           COMPARE_LOG_RESULT);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (local_358 != &local_348) {
        operator_delete(local_358,local_348 + 1);
      }
      uVar12 = uVar12 + bVar2;
      layer = layer + 1;
    } while (layer != local_35c);
  }
  return uVar12 == local_35c;
}

Assistant:

bool comparePixelBuffers (tcu::TestLog&						log,
						  const Texture&					texture,
						  const VkFormat					format,
						  const tcu::ConstPixelBufferAccess	reference,
						  const tcu::ConstPixelBufferAccess	result)
{
	DE_ASSERT(reference.getFormat() == result.getFormat());
	DE_ASSERT(reference.getSize() == result.getSize());

	const bool intFormat = isIntegerFormat(format);
	const bool is3d = (texture.type() == IMAGE_TYPE_3D);
	const int numLayersOrSlices = (is3d ? texture.size().z() : texture.numLayers());
	const int numCubeFaces = 6;

	int passedLayers = 0;
	for (int layerNdx = 0; layerNdx < numLayersOrSlices; ++layerNdx)
	{
		const std::string comparisonName = "Comparison" + de::toString(layerNdx);
		const std::string comparisonDesc = "Image Comparison, " +
			(isCube(texture) ? "face " + de::toString(layerNdx % numCubeFaces) + ", cube " + de::toString(layerNdx / numCubeFaces) :
			is3d			 ? "slice " + de::toString(layerNdx) : "layer " + de::toString(layerNdx));

		const tcu::ConstPixelBufferAccess refLayer = getLayerOrSlice(texture, reference, layerNdx);
		const tcu::ConstPixelBufferAccess resultLayer = getLayerOrSlice(texture, result, layerNdx);

		bool ok = false;
		if (intFormat)
			ok = tcu::intThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), refLayer, resultLayer, tcu::UVec4(0), tcu::COMPARE_LOG_RESULT);
		else
			ok = tcu::floatThresholdCompare(log, comparisonName.c_str(), comparisonDesc.c_str(), refLayer, resultLayer, tcu::Vec4(0.01f), tcu::COMPARE_LOG_RESULT);

		if (ok)
			++passedLayers;
	}
	return passedLayers == numLayersOrSlices;
}